

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4address.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPIPv4Address::IsFromSameHost(RTPIPv4Address *this,RTPAddress *addr)

{
  if ((addr != (RTPAddress *)0x0) && (addr->addresstype == IPv4Address)) {
    return *(int *)&addr->field_0xc == *(int *)&(this->super_RTPAddress).field_0xc;
  }
  return false;
}

Assistant:

bool RTPIPv4Address::IsFromSameHost(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != IPv4Address)
		return false;
	
	const RTPIPv4Address *addr2 = (const RTPIPv4Address *)addr;
	if (addr2->GetIP() == ip)
		return true;
	return false;
}